

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<long_double>::PrepareZ
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,
          longdouble beta,int opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  longdouble *plVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar2 = (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar1,lVar2);
  if (0 < lVar2) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar3 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
      if ((lVar3 < 1) || ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      plVar4 = z->fElem;
      if ((beta != (longdouble)0) || (NAN(beta) || NAN((longdouble)0))) {
        if (z != y) {
          memcpy(plVar4 + lVar3 * lVar8,
                 y->fElem + (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar8,
                 lVar1 << 4);
        }
        if (0 < lVar1) {
          lVar3 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          lVar10 = 0;
          lVar9 = 0;
          do {
            if ((lVar3 <= lVar9) ||
               ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar8)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar6 = lVar7 * lVar3;
            *(longdouble *)((long)z->fElem + lVar10 + lVar6) =
                 beta * *(longdouble *)((long)z->fElem + lVar10 + lVar6);
            lVar9 = lVar9 + 1;
            lVar10 = lVar10 + 0x10;
          } while (lVar1 != lVar9);
        }
      }
      else if (lVar1 != 0) {
        sVar5 = 0;
        do {
          *(longdouble *)((long)plVar4 + sVar5 + lVar3 * lVar7) = (longdouble)0;
          sVar5 = sVar5 + 0x10;
        } while (lVar1 << 4 != sVar5);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 != lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}